

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

void __thiscall ON_3fPoint::Transform(ON_3fPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar10 = (double)this->x;
  dVar13 = (double)this->y;
  dVar11 = (double)this->z;
  dVar12 = xform->m_xform[3][2] * dVar11 +
           xform->m_xform[3][0] * dVar10 + xform->m_xform[3][1] * dVar13 + xform->m_xform[3][3];
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_point.cpp"
               ,0x58a,"","divide by zero.");
    this->z = NanPoint.z;
    fVar9 = NanPoint.y;
    this->x = NanPoint.x;
    this->y = fVar9;
    return;
  }
  dVar1 = xform->m_xform[1][1];
  dVar2 = xform->m_xform[1][0];
  dVar3 = xform->m_xform[1][2];
  dVar4 = xform->m_xform[1][3];
  dVar5 = xform->m_xform[2][1];
  dVar6 = xform->m_xform[2][0];
  dVar7 = xform->m_xform[2][2];
  dVar8 = xform->m_xform[2][3];
  this->x = (float)((xform->m_xform[0][2] * dVar11 +
                     xform->m_xform[0][0] * dVar10 + xform->m_xform[0][1] * dVar13 +
                    xform->m_xform[0][3]) / dVar12);
  this->y = (float)((dVar3 * dVar11 + dVar2 * dVar10 + dVar1 * dVar13 + dVar4) / dVar12);
  this->z = (float)((dVar11 * dVar7 + dVar10 * dVar6 + dVar13 * dVar5 + dVar8) / dVar12);
  return;
}

Assistant:

void ON_3fPoint::Transform( const ON_Xform& xform )
{
  const double ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][2]*z + xform.m_xform[3][3];
  if (0.0 == ww)
  {
    ON_ERROR("divide by zero.");
    *this = ON_3fPoint::NanPoint;
  }
  else
  {
    const double xx = (xform.m_xform[0][0] * x + xform.m_xform[0][1] * y + xform.m_xform[0][2] * z + xform.m_xform[0][3]) / ww;
    const double yy = (xform.m_xform[1][0] * x + xform.m_xform[1][1] * y + xform.m_xform[1][2] * z + xform.m_xform[1][3]) / ww;
    const double zz = (xform.m_xform[2][0] * x + xform.m_xform[2][1] * y + xform.m_xform[2][2] * z + xform.m_xform[2][3]) / ww;
    x = (float)xx;
    y = (float)yy;
    z = (float)zz;
  }
}